

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderResourceBindingBase.hpp
# Opt level: O0

SHADER_RESOURCE_VARIABLE_TYPE_FLAGS __thiscall
Diligent::ShaderResourceBindingBase<Diligent::EngineVkImplTraits>::CheckResources
          (ShaderResourceBindingBase<Diligent::EngineVkImplTraits> *this,SHADER_TYPE ShaderStages,
          IResourceMapping *pResMapping,BIND_SHADER_RESOURCES_FLAGS Flags)

{
  anon_class_24_3_cd5e4a19 local_40;
  SHADER_RESOURCE_VARIABLE_TYPE_FLAGS local_28;
  BIND_SHADER_RESOURCES_FLAGS local_24;
  SHADER_RESOURCE_VARIABLE_TYPE_FLAGS StaleVarTypes;
  BIND_SHADER_RESOURCES_FLAGS Flags_local;
  IResourceMapping *pResMapping_local;
  ShaderResourceBindingBase<Diligent::EngineVkImplTraits> *pSStack_10;
  SHADER_TYPE ShaderStages_local;
  ShaderResourceBindingBase<Diligent::EngineVkImplTraits> *this_local;
  
  local_28 = SHADER_RESOURCE_VARIABLE_TYPE_FLAG_NONE;
  local_40.pResMapping = (IResourceMapping **)&StaleVarTypes;
  local_40.Flags = &local_24;
  local_40.StaleVarTypes = &local_28;
  local_24 = Flags;
  _StaleVarTypes = pResMapping;
  pResMapping_local._4_4_ = ShaderStages;
  pSStack_10 = this;
  ProcessVariables<Diligent::ShaderResourceBindingBase<Diligent::EngineVkImplTraits>::CheckResources(Diligent::SHADER_TYPE,Diligent::IResourceMapping*,Diligent::BIND_SHADER_RESOURCES_FLAGS)const::_lambda(Diligent::ShaderVariableManagerVk_const&)_1_>
            (this,ShaderStages,&local_40);
  return local_28;
}

Assistant:

CheckResources(
        SHADER_TYPE                 ShaderStages,
        IResourceMapping*           pResMapping,
        BIND_SHADER_RESOURCES_FLAGS Flags) const override final
    {
        SHADER_RESOURCE_VARIABLE_TYPE_FLAGS StaleVarTypes = SHADER_RESOURCE_VARIABLE_TYPE_FLAG_NONE;
        ProcessVariables(ShaderStages,
                         [&](const ShaderVariableManagerImplType& Mgr) //
                         {
                             Mgr.CheckResources(pResMapping, Flags, StaleVarTypes);
                             // Stop when both mutable and dynamic variables are stale as there is no reason to check further.
                             return (StaleVarTypes & SHADER_RESOURCE_VARIABLE_TYPE_FLAG_MUT_DYN) != SHADER_RESOURCE_VARIABLE_TYPE_FLAG_MUT_DYN;
                         });
        return StaleVarTypes;
    }